

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_timer.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ulong uVar2;
  ALLEGRO_EVENT_QUEUE *pAVar3;
  undefined8 uVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ALLEGRO_COLOR c;
  float speed;
  uint last_timer;
  _Bool redraw;
  int bps;
  ALLEGRO_EVENT event;
  ALLEGRO_TRANSFORM trans;
  undefined8 local_b8;
  uint local_a4;
  int local_9c;
  int local_98 [6];
  long local_80;
  int local_78;
  int local_74;
  undefined1 local_50 [32];
  
  local_9c = 4;
  bVar1 = false;
  local_a4 = 0;
  uVar2 = al_install_system(0x5020700,atexit);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log();
  al_install_keyboard();
  display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
  if (display == (ALLEGRO_DISPLAY *)0x0) {
    abort_example("Could not create display\n");
  }
  font = (ALLEGRO_FONT *)al_create_builtin_font();
  if (font == (ALLEGRO_FONT *)0x0) {
    abort_example("Could not create font\n");
  }
  uVar2 = al_install_audio();
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init sound\n");
  }
  uVar2 = al_reserve_samples(0x10);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not set up voice and mixer\n");
  }
  ping = generate_ping();
  if (ping == (ALLEGRO_SAMPLE *)0x0) {
    abort_example("Could not generate sample\n");
  }
  timer = (ALLEGRO_TIMER *)al_create_timer(0x3fd0000000000000);
  al_set_timer_count(timer,0xffffffffffffffff);
  pAVar3 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
  event_queue = pAVar3;
  uVar4 = al_get_keyboard_event_source();
  al_register_event_source(pAVar3,uVar4);
  pAVar3 = event_queue;
  uVar4 = al_get_timer_event_source(timer);
  al_register_event_source(pAVar3,uVar4);
  al_identity_transform(local_50);
  al_scale_transform(0x41800000,local_50);
  al_use_transform(local_50);
  al_start_timer(timer);
  do {
    al_wait_for_event(event_queue,local_98);
    if (local_98[0] == 0x1e) {
      dVar5 = pow(1.05,(double)(local_80 % 5));
      uVar2 = al_play_sample(0x3f800000,0,(float)dVar5,ping,0x100,0);
      if ((uVar2 & 1) == 0) {
        log_printf("Not enough reserved samples.\n");
      }
      bVar1 = true;
      local_a4 = (uint)local_80;
    }
    else if (local_98[0] == 0xb) {
      if (local_78 == 0x3b) {
        close_log(false);
        return 0;
      }
      if ((local_74 == 0x2b) || (local_74 == 0x3d)) {
        if (local_9c < 0x20) {
          local_9c = local_9c + 1;
          al_set_timer_speed(1.0 / (double)local_9c,timer);
        }
      }
      else if ((local_74 == 0x2d) && (1 < local_9c)) {
        local_9c = local_9c + -1;
        al_set_timer_speed(1.0 / (double)local_9c,timer);
      }
    }
    if ((bVar1) && (uVar2 = al_is_event_queue_empty(event_queue), (uVar2 & 1) != 0)) {
      if (local_a4 % 5 == 0) {
        uVar4 = 0x3f800000;
        local_b8 = al_map_rgb_f(0x3f800000);
      }
      else {
        uVar4 = 0x3f000000;
        local_b8 = al_map_rgb_f(0x3f000000,0x3f000000,0x3f800000);
      }
      uVar7 = uVar4;
      uVar6 = al_map_rgb(0,0);
      al_clear_to_color(uVar6,uVar7);
      al_draw_textf(local_b8,uVar4,0x41a00000,0x41300000,font,1,"%u",local_a4);
      al_flip_display();
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_TRANSFORM trans;
   ALLEGRO_EVENT event;
   int bps = 4;
   bool redraw = false;
   unsigned int last_timer = 0;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   al_install_keyboard();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Could not create display\n");
   }

   font = al_create_builtin_font();
   if (!font) {
      abort_example("Could not create font\n");
   }

   if (!al_install_audio()) {
      abort_example("Could not init sound\n");
   }

   if (!al_reserve_samples(RESERVED_SAMPLES)) {
      abort_example("Could not set up voice and mixer\n");
   }

   ping = generate_ping();
   if (!ping) {
      abort_example("Could not generate sample\n");
   }

   timer = al_create_timer(1.0 / bps);
   al_set_timer_count(timer, -1);

   event_queue = al_create_event_queue();
   al_register_event_source(event_queue, al_get_keyboard_event_source());
   al_register_event_source(event_queue, al_get_timer_event_source(timer));

   al_identity_transform(&trans);
   al_scale_transform(&trans, 16.0, 16.0);
   al_use_transform(&trans);

   al_start_timer(timer);

   while (true) {
      al_wait_for_event(event_queue, &event);
      if (event.type == ALLEGRO_EVENT_TIMER) {
         const float speed = pow(21.0/20.0, (event.timer.count % PERIOD));
         if (!al_play_sample(ping, 1.0, 0.0, speed, ALLEGRO_PLAYMODE_ONCE, NULL)) {
            log_printf("Not enough reserved samples.\n");
         }
         redraw = true;
         last_timer = event.timer.count;
      }
      else if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
            break;
         }
         if (event.keyboard.unichar == '+' || event.keyboard.unichar == '=') {
            if (bps < 32) {
               bps++;
               al_set_timer_speed(timer, 1.0 / bps);
            }
         }
         else if (event.keyboard.unichar == '-') {
            if (bps > 1) {
               bps--;
               al_set_timer_speed(timer, 1.0 / bps);
            }
         }
      }

      if (redraw && al_is_event_queue_empty(event_queue)) {
         ALLEGRO_COLOR c;
         if (last_timer % PERIOD == 0)
            c = al_map_rgb_f(1, 1, 1);
         else
            c = al_map_rgb_f(0.5, 0.5, 1.0);

         al_clear_to_color(al_map_rgb(0, 0, 0));
         al_draw_textf(font, c, 640/32, 480/32 - 4, ALLEGRO_ALIGN_CENTRE,
            "%u", last_timer);
         al_flip_display();
      }
   }

   close_log(false);

   return 0;
}